

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

int32 __thiscall nuraft::raft_server::get_quorum_for_election(raft_server *this)

{
  int iVar1;
  int32 iVar2;
  ptr<raft_params> params;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  context::get_params((context *)&stack0xffffffffffffffe8);
  iVar2 = get_num_voting_members(this);
  iVar1 = *(int *)((long)&local_18[7]._vptr_state_mgr + 4);
  if (iVar1 < 1 || iVar2 < iVar1) {
    iVar2 = iVar2 / 2;
  }
  else {
    iVar2 = iVar1 + -1;
  }
  if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10._M_pi);
  }
  return iVar2;
}

Assistant:

int32 raft_server::get_quorum_for_election() {
    ptr<raft_params> params = ctx_->get_params();
    int32 num_voting_members = get_num_voting_members();
    if ( params->custom_election_quorum_size_ <= 0 ||
         params->custom_election_quorum_size_ > num_voting_members ) {
        return num_voting_members / 2;
    }
    return params->custom_election_quorum_size_ - 1;
}